

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autodumper.cpp
# Opt level: O0

void autoDump(string *pathIn,string *baseNamePathOut,CRC32Lookup *crc,bool recursive,bool autoConv)

{
  CRC32Lookup *this;
  bool bVar1;
  byte bVar2;
  ZounaClasses type_00;
  int iVar3;
  dirent *pdVar4;
  Parser *pPVar5;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *prVar7;
  char *pcVar8;
  byte local_734;
  string local_6f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  string local_698;
  string local_678;
  undefined1 local_652;
  allocator local_651;
  string local_650;
  string local_630;
  CRC32Lookup local_610;
  string local_5e0 [32];
  long *local_5c0;
  ParserResult *result;
  runtime_error e;
  CRC32Lookup local_5a8;
  string local_578;
  string local_558;
  string local_538 [32];
  string local_518;
  undefined1 local_4f8 [8];
  string path;
  string local_4a8 [32];
  long *local_488;
  ParserResult *result_2;
  string local_460;
  CRC32Lookup local_440;
  string local_410 [32];
  long *local_3f0;
  ParserResult *result_1;
  string fileExt;
  Parser *parser;
  string local_360;
  ZounaClasses local_33c;
  undefined1 local_338 [4];
  ZounaClasses type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  string local_2c8;
  CRC32Lookup local_2a8;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string newbase;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string totalPath;
  undefined1 local_88 [8];
  string childPath;
  DIR *dir;
  dirent *entry;
  string local_48;
  byte local_22;
  byte local_21;
  bool autoConv_local;
  CRC32Lookup *pCStack_20;
  bool recursive_local;
  CRC32Lookup *crc_local;
  string *baseNamePathOut_local;
  string *pathIn_local;
  undefined4 extraout_var;
  
  local_22 = autoConv;
  local_21 = recursive;
  pCStack_20 = crc;
  crc_local = (CRC32Lookup *)baseNamePathOut;
  baseNamePathOut_local = pathIn;
  std::__cxx11::string::string((string *)&local_48,(string *)pathIn);
  bVar1 = isADirectory(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    childPath.field_2._8_8_ = 0;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    childPath.field_2._8_8_ = opendir(pcVar8);
    do {
      pdVar4 = readdir((DIR *)childPath.field_2._8_8_);
      if (pdVar4 == (dirent *)0x0) {
        closedir((DIR *)childPath.field_2._8_8_);
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_88,pdVar4->d_name,
                 (allocator *)(totalPath.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(totalPath.field_2._M_local_buf + 0xf));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,".");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,".."), bVar1)) {
        totalPath.field_2._8_4_ = 2;
      }
      else {
        std::__cxx11::string::string((string *)&local_f0,(string *)pathIn);
        trailFolder(&local_d0,&local_f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string((string *)&local_110,(string *)local_b0);
        bVar1 = isADirectory(&local_110);
        local_734 = 0;
        if (bVar1) {
          local_734 = local_21;
        }
        std::__cxx11::string::~string((string *)&local_110);
        if ((local_734 & 1) == 0) {
          std::__cxx11::string::string((string *)&local_2c8,(string *)local_b0);
          std::operator+(&local_308,baseNamePathOut,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          getFileBase(&local_2e8,&local_308);
          CRC32Lookup::CRC32Lookup((CRC32Lookup *)local_338,crc);
          autoDump(&local_2c8,&local_2e8,(CRC32Lookup *)local_338,(bool)(local_21 & 1),
                   (bool)(local_22 & 1));
          CRC32Lookup::~CRC32Lookup((CRC32Lookup *)local_338);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_2c8);
          totalPath.field_2._8_4_ = 0;
        }
        else {
          std::__cxx11::string::string
                    ((string *)(newbase.field_2._M_local_buf + 8),(string *)baseNamePathOut);
          bVar1 = isADirectory((string *)((long)&newbase.field_2 + 8));
          std::__cxx11::string::~string((string *)(newbase.field_2._M_local_buf + 8));
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            mkdir(pcVar8,0x1c0);
          }
          std::__cxx11::string::string((string *)&local_190,(string *)baseNamePathOut);
          trailFolder(&local_170,&local_190);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,&local_170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::string((string *)&local_1b0,(string *)local_150);
          bVar1 = isADirectory(&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar3 = mkdir(pcVar8,0x1c0);
            if (iVar3 != 0) {
              local_1f2 = 1;
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1f0,"Couldn\'t open %s for writing!\n",&local_1f1);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              formatString<char_const*>(&local_1d0,&local_1f0,pcVar8);
              std::runtime_error::runtime_error(prVar7,(string *)&local_1d0);
              local_1f2 = 0;
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          std::__cxx11::string::string((string *)&local_238,(string *)local_b0);
          trailFolder(&local_218,&local_238);
          std::__cxx11::string::string((string *)&local_278,(string *)local_150);
          trailFolder(&local_258,&local_278);
          CRC32Lookup::CRC32Lookup(&local_2a8,crc);
          autoDump(&local_218,&local_258,&local_2a8,(bool)(local_21 & 1),(bool)(local_22 & 1));
          CRC32Lookup::~CRC32Lookup(&local_2a8);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          totalPath.field_2._8_4_ = 2;
          std::__cxx11::string::~string((string *)local_150);
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
      std::__cxx11::string::~string((string *)local_88);
    } while( true );
  }
  std::__cxx11::string::string((string *)&local_360,(string *)pathIn);
  CRC32Lookup::CRC32Lookup((CRC32Lookup *)&parser,crc);
  type_00 = autoDetectFile(&local_360,(CRC32Lookup *)&parser);
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&parser);
  std::__cxx11::string::~string((string *)&local_360);
  this = (CRC32Lookup *)((long)&fileExt.field_2 + 8);
  local_33c = type_00;
  CRC32Lookup::CRC32Lookup(this,crc);
  pPVar5 = getMatchingParser(type_00,this);
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)((long)&fileExt.field_2 + 8));
  std::__cxx11::string::string((string *)&result_1);
  if (local_33c == DPC) {
    std::__cxx11::string::string(local_4a8,(string *)pathIn);
    CRC32Lookup::CRC32Lookup((CRC32Lookup *)((long)&path.field_2 + 8),crc);
    iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_4a8,(undefined1 *)((long)&path.field_2 + 8));
    CRC32Lookup::~CRC32Lookup((CRC32Lookup *)((long)&path.field_2 + 8));
    std::__cxx11::string::~string(local_4a8);
    local_488 = (long *)CONCAT44(extraout_var_00,iVar3);
    std::__cxx11::string::string((string *)&local_518,(string *)baseNamePathOut);
    trailFolder((string *)local_4f8,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    plVar6 = local_488;
    std::__cxx11::string::string(local_538,(string *)local_4f8);
    (**(code **)(*plVar6 + 0x18))(plVar6,local_538);
    std::__cxx11::string::~string(local_538);
    if ((local_22 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_558,(string *)local_4f8);
      std::__cxx11::string::string((string *)&local_578,(string *)local_4f8);
      CRC32Lookup::CRC32Lookup(&local_5a8,crc);
      autoDump(&local_558,&local_578,&local_5a8,(bool)(local_21 & 1),(bool)(local_22 & 1));
      CRC32Lookup::~CRC32Lookup(&local_5a8);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_558);
    }
    if (pPVar5 != (Parser *)0x0) {
      (*pPVar5->_vptr_Parser[1])();
    }
    if (local_488 != (long *)0x0) {
      (**(code **)(*local_488 + 0x10))();
    }
    std::__cxx11::string::~string((string *)local_4f8);
    totalPath.field_2._8_4_ = 1;
  }
  else if (local_33c == sdx) {
    std::__cxx11::string::string(local_410,(string *)pathIn);
    CRC32Lookup::CRC32Lookup(&local_440,crc);
    iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_410,&local_440);
    plVar6 = (long *)CONCAT44(extraout_var,iVar3);
    CRC32Lookup::~CRC32Lookup(&local_440);
    std::__cxx11::string::~string(local_410);
    local_3f0 = plVar6;
    std::__cxx11::string::string((string *)&result_2,(string *)baseNamePathOut);
    trailFolder(&local_460,(string *)&result_2);
    (**(code **)(*plVar6 + 0x18))(plVar6,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&result_2);
    if (pPVar5 != (Parser *)0x0) {
      (*pPVar5->_vptr_Parser[1])();
    }
    if (local_3f0 != (long *)0x0) {
      (**(code **)(*local_3f0 + 0x10))();
    }
    totalPath.field_2._8_4_ = 1;
  }
  else {
    if (local_33c == Bitmap_Z) {
      std::__cxx11::string::operator=((string *)&result_1,"png");
    }
    else if (local_33c == Mesh_Z) {
      std::__cxx11::string::operator=((string *)&result_1,"obj");
    }
    else {
      if (local_33c != Sound_Z) {
        totalPath.field_2._8_4_ = 1;
        goto LAB_00108268;
      }
      std::__cxx11::string::operator=((string *)&result_1,"wav");
    }
    std::__cxx11::string::string(local_5e0,(string *)pathIn);
    CRC32Lookup::CRC32Lookup(&local_610,crc);
    iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_5e0,&local_610);
    local_5c0 = (long *)CONCAT44(extraout_var_01,iVar3);
    CRC32Lookup::~CRC32Lookup(&local_610);
    std::__cxx11::string::~string(local_5e0);
    if (local_5c0 == (long *)0x0) {
      local_652 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_650,"Couldn\'t parse %s!\n",&local_651);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      formatString<char_const*>(&local_630,&local_650,pcVar8);
      std::runtime_error::runtime_error(prVar7,(string *)&local_630);
      local_652 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_698,(string *)baseNamePathOut);
    getFileExtension(&local_678,&local_698);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_698);
    plVar6 = local_5c0;
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string(local_6f8,(string *)baseNamePathOut);
      (**(code **)(*plVar6 + 0x18))(plVar6,local_6f8);
      std::__cxx11::string::~string(local_6f8);
    }
    else {
      std::operator+(&local_6d8,baseNamePathOut,".");
      std::operator+(&local_6b8,&local_6d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_1)
      ;
      (**(code **)(*plVar6 + 0x18))(plVar6,&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
    }
    if (pPVar5 != (Parser *)0x0) {
      (*pPVar5->_vptr_Parser[1])();
    }
    if (local_5c0 != (long *)0x0) {
      (**(code **)(*local_5c0 + 0x10))();
    }
    totalPath.field_2._8_4_ = 0;
  }
LAB_00108268:
  std::__cxx11::string::~string((string *)&result_1);
  return;
}

Assistant:

void autoDump(std::string pathIn, std::string baseNamePathOut, CRC32Lookup crc, bool recursive, bool autoConv){
    if(isADirectory(pathIn)){
        struct dirent *entry = nullptr;
        DIR *dir = nullptr;
        dir = opendir(pathIn.c_str());
        while( (entry=readdir(dir))){
            std::string childPath = entry->d_name;
            //delete entry;
            if (childPath=="." || childPath == "..")
                continue;
            std::string totalPath = trailFolder(pathIn)+childPath;
            if(isADirectory(totalPath)&&recursive){
                if(!isADirectory(baseNamePathOut))
                    mkdir(baseNamePathOut.c_str(),S_IRWXU);
                std::string newbase= trailFolder(baseNamePathOut)+childPath;
                if (!isADirectory(newbase))
                    if ( mkdir(newbase.c_str(), 0700) != 0)
                        throw CANT_WRITE(newbase.c_str());
                autoDump(trailFolder(totalPath),trailFolder(newbase),crc,recursive,autoConv);
                continue;
            }
            autoDump(totalPath,getFileBase(baseNamePathOut+childPath),crc,recursive,autoConv);
        }
        closedir(dir);
        return;
    }
    ZounaClasses type = autoDetectFile(pathIn,crc);
    //TODO: avoid having to initialize a parser object every darn time
    Parser *parser = getMatchingParser(type,crc);

    std::string fileExt;
    switch(type){

    case ZounaClasses::Bitmap_Z:
        fileExt="png";
        break;
    case ZounaClasses::Mesh_Z:
        fileExt="obj";
        break;

    case ZounaClasses::Sound_Z:
        fileExt="wav";
        break;
    case ZounaClasses::sdx:{
        ParserResult *result = parser->parseFile(pathIn,crc);
        result->dump(trailFolder(baseNamePathOut));
        delete parser;
        delete result;
        return;
    }

    case ZounaClasses::DPC:
        try{
            ParserResult *result = parser->parseFile(pathIn,crc);
            std::string path = trailFolder(baseNamePathOut);
            result->dump(path);
            if (autoConv)
                autoDump(path,path,crc,recursive,autoConv);
            delete parser;
            delete result;
        }catch(std::runtime_error e){
            std::cout<<e.what();
        }
        return;
    default:
        //How
        return;
    }
    ParserResult *result;
    result = parser->parseFile(pathIn,crc);
    if (result == nullptr)
        throw CANT_PARSE(pathIn.c_str());
    if (getFileExtension(baseNamePathOut).empty())
        result->dump(baseNamePathOut+"."+fileExt);
    else
        result->dump(baseNamePathOut); //TODO: check given file-extension vs expected extension
    delete parser;
    delete result;
}